

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O3

void __thiscall
duckdb::LocalUngroupedAggregateState::Sink
          (LocalUngroupedAggregateState *this,DataChunk *payload_chunk,idx_t payload_idx,
          idx_t aggr_idx)

{
  aggregate_simple_update_t p_Var1;
  const_reference this_00;
  pointer this_01;
  BoundAggregateExpression *pBVar2;
  reference pvVar3;
  reference pvVar4;
  long lVar5;
  AggregateInputData aggr_input_data;
  Vector *local_50;
  AggregateInputData local_48;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[]((this->state).aggregate_expressions,aggr_idx);
  this_01 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(this_00);
  pBVar2 = BaseExpression::Cast<duckdb::BoundAggregateExpression>(&this_01->super_BaseExpression);
  lVar5 = (long)(pBVar2->children).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pBVar2->children).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar5 == 0) {
    local_50 = (Vector *)0x0;
  }
  else {
    local_50 = vector<duckdb::Vector,_true>::operator[](&payload_chunk->data,payload_idx);
  }
  pvVar3 = vector<duckdb::optional_ptr<duckdb::FunctionData,_true>,_true>::operator[]
                     (&(this->state).bind_data,aggr_idx);
  local_48.bind_data.ptr = pvVar3->ptr;
  local_48.allocator = this->allocator;
  local_48.combine_type = PRESERVE_INPUT;
  p_Var1 = (pBVar2->function).simple_update;
  pvVar4 = vector<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_true>
           ::operator[](&(this->state).aggregate_data,aggr_idx);
  (*p_Var1)(local_50,&local_48,lVar5 >> 3,
            (pvVar4->super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)._M_t.
            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,payload_chunk->count);
  return;
}

Assistant:

void LocalUngroupedAggregateState::Sink(DataChunk &payload_chunk, idx_t payload_idx, idx_t aggr_idx) {
#ifdef DEBUG
	state.counts[aggr_idx] += payload_chunk.size();
#endif
	auto &aggregate = state.aggregate_expressions[aggr_idx]->Cast<BoundAggregateExpression>();
	idx_t payload_cnt = aggregate.children.size();
	D_ASSERT(payload_idx + payload_cnt <= payload_chunk.data.size());
	auto start_of_input = payload_cnt == 0 ? nullptr : &payload_chunk.data[payload_idx];
	AggregateInputData aggr_input_data(state.bind_data[aggr_idx], allocator);
	aggregate.function.simple_update(start_of_input, aggr_input_data, payload_cnt, state.aggregate_data[aggr_idx].get(),
	                                 payload_chunk.size());
}